

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

function<bool_(const_void_*,_void_*)> * __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>::
function(QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
         *this,pair<int,_int> k)

{
  Span *pSVar1;
  ulong uVar2;
  function<bool_(const_void_*,_void_*)> *pfVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  pair<int,_int> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = k;
  QReadWriteLock::lockForRead(&this->lock);
  cVar4 = QHash<std::pair<int,int>,std::function<bool(void_const*,void*)>>::
          constFindImpl<std::pair<int,int>>
                    ((QHash<std::pair<int,int>,std::function<bool(void_const*,void*)>> *)&this->map,
                     &local_20);
  if (cVar4.i.d ==
      (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_> *
      )0x0 && cVar4.i.bucket == 0) {
    pfVar3 = (function<bool_(const_void_*,_void_*)> *)0x0;
  }
  else {
    pSVar1 = (cVar4.i.d)->spans;
    uVar2 = cVar4.i.bucket >> 7;
    pfVar3 = (function<bool_(const_void_*,_void_*)> *)
             (pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)cVar4.i.bucket & 0x7f]].storage.data
             + 8);
  }
  QReadWriteLock::unlock(&this->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pfVar3;
  }
  __stack_chk_fail();
}

Assistant:

const T *function(Key k) const
    {
        const QReadLocker locker(&lock);
        auto it = map.find(k);
        return it == map.end() ? nullptr : std::addressof(*it);
    }